

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * Extra_zddTuplesFromBdd(DdManager *dd,int K,DdNode *bVarsN)

{
  int iVar1;
  DdNode *pDVar2;
  int local_50;
  int local_4c;
  int i;
  int nVars;
  DdNode *bVarsK;
  DdNode *bVarSet;
  int autoDynZ;
  DdNode *zRes;
  DdNode *bVarsN_local;
  int K_local;
  DdManager *dd_local;
  
  iVar1 = dd->autoDynZ;
  dd->autoDynZ = 0;
  while( true ) {
    local_4c = 0;
    for (bVarsK = bVarsN; bVarsK != dd->one; bVarsK = (bVarsK->type).kids.T) {
      local_4c = local_4c + 1;
      if ((bVarsK->type).kids.E != (DdNode *)((ulong)dd->one ^ 1)) {
        return (DdNode *)0x0;
      }
    }
    if (local_4c < K) break;
    _i = bVarsN;
    for (local_50 = 0; local_50 < local_4c - K; local_50 = local_50 + 1) {
      _i = (_i->type).kids.T;
    }
    dd->reordered = 0;
    pDVar2 = extraZddTuplesFromBdd(dd,_i,bVarsN);
    if (dd->reordered != 1) {
      dd->autoDynZ = iVar1;
      return pDVar2;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode* Extra_zddTuplesFromBdd( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *zRes;
    int     autoDynZ;

    autoDynZ = dd->autoDynZ;
    dd->autoDynZ = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode* argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *bVarSet = bVarsN, *bVarsK = bVarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( bVarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( bVarSet ) != b0 )
                return NULL;
            bVarSet = cuddT( bVarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stannds for <n>;
         * reate the first argument, which stands for <k>
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            bVarsK = cuddT( bVarsK );

        dd->reordered = 0;
        zRes = extraZddTuplesFromBdd(dd, bVarsK, bVarsN );

    } while (dd->reordered == 1);
    dd->autoDynZ = autoDynZ;
    return zRes;

}